

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
gmath::operator>>(basic_istream<char,_std::char_traits<char>_> *in,DMatrix<double> *a)

{
  int iVar1;
  iterator __position;
  pointer pdVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elem;
  double v;
  char local_69;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator>>(in,&local_69);
  if (local_69 == '[') {
    do {
      if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) != 0) break;
      std::operator>>(in,&local_69);
      if (local_69 == ';') {
LAB_0010b505:
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
        ::emplace_back<std::vector<double,std::allocator<double>>>
                  ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                    *)&local_68,&local_48);
        if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        while (((local_69 != ';' && (local_69 != ']')) &&
               (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0))) {
          std::operator>>(in,&local_69);
          if ((local_69 != ';') && (local_69 != ']')) {
            std::istream::putback((char)in);
            std::istream::_M_extract<double>((double *)in);
            __position._M_current =
                 local_68.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish;
            if (__position._M_current ==
                local_68.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)
                         (local_68.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1),__position,&local_50);
            }
            else {
              *__position._M_current = local_50;
              local_68.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = __position._M_current + 1;
            }
          }
        }
        if (((*(uint *)(in + *(long *)(*(long *)in + -0x18) + 0x20) & 5) == 0) &&
           ((long)((local_68.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)((local_68.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start !=
            (long)local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start)) {
          std::ios::clear((int)*(long *)(*(long *)in + -0x18) + (int)in);
        }
      }
      else if (local_69 != ']') {
        std::istream::putback((char)in);
        goto LAB_0010b505;
      }
    } while (local_69 != ']');
    if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
      uVar7 = ((long)local_68.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar6 = (uint)uVar7;
      if ((int)uVar6 < 1) {
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)((long)((local_68.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)((local_68.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 3;
      }
      DMatrix<double>::init(a,(EVP_PKEY_CTX *)(uVar7 & 0xffffffff));
      if (0 < (int)uVar6) {
        pdVar3 = a->v;
        iVar1 = a->ncols;
        uVar7 = 0;
        do {
          if (0 < (int)uVar5) {
            pdVar2 = local_68.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar4 = 0;
            do {
              pdVar3[uVar4] = pdVar2[uVar4];
              uVar4 = uVar4 + 1;
            } while ((uVar5 & 0xffffffff) != uVar4);
          }
          uVar7 = uVar7 + 1;
          pdVar3 = pdVar3 + iVar1;
        } while (uVar7 != (uVar6 & 0x7fffffff));
      }
    }
  }
  else {
    std::ios::clear((int)in + (int)*(undefined8 *)(*(long *)in + -0x18));
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_68);
  return in;
}

Assistant:

std::basic_istream<Ch, Tr> &operator>>(std::basic_istream<Ch, Tr> &in, DMatrix<T> &a)
{
  T    v;
  std::vector<std::vector<T> > elem;
  char c;

  in >> c;

  if (c == '[')
  {
    while (c != ']' && in)
    {
      in >> c;

      if (c != ']')
      {
        if (c != ';')
        {
          in.putback(c);
        }

        elem.push_back(std::vector<T>());

        while (c != ';' && c != ']' && in)
        {
          in >> c;

          if (c != ';' && c != ']')
          {
            in.putback(c);

            in >> v;
            elem.back().push_back(v);
          }
        }

        if (in && elem.front().size() != elem.back().size())
        {
          in.setstate(std::ios_base::failbit);
        }
      }
    }

    if (in)
    {
      int rows=static_cast<int>(elem.size());
      int cols=0;

      if (rows > 0)
      {
        cols=static_cast<int>(elem.front().size());
      }

      a.init(rows, cols);

      for (int k=0; k<rows; k++)
        for (int i=0; i<cols; i++)
        {
          a(k, i)=elem[k][i];
        }
    }
  }
  else
  {
    in.setstate(std::ios_base::failbit);
  }

  return in;
}